

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_SetPipeFile(cmsysProcess *cp,int prPipe,char *file)

{
  uint uVar1;
  size_t sVar2;
  char *__dest;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if ((cp != (cmsysProcess *)0x0) && (uVar1 = prPipe - 1, iVar3 = 0, uVar1 < 3)) {
    uVar4 = (ulong)uVar1;
    if (*(void **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) != (void *)0x0) {
      free(*(void **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9));
      (cp->PipeNativeSTDIN + uVar4 * 2 + -9)[0] = 0;
      (cp->PipeNativeSTDIN + uVar4 * 2 + -9)[1] = 0;
    }
    if (file != (char *)0x0) {
      sVar2 = strlen(file);
      __dest = (char *)malloc(sVar2 + 1);
      *(char **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) = __dest;
      if (__dest == (char *)0x0) {
        return 0;
      }
      strcpy(__dest,file);
    }
    iVar3 = 1;
    if ((*(long *)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) != 0) && (uVar1 < 3)) {
      (cp->PipeNativeSTDIN + uVar4 * 2)[0] = -1;
      (cp->PipeNativeSTDIN + uVar4 * 2)[1] = -1;
      if (prPipe == 3) {
        cp->PipeSharedSTDERR = 0;
      }
      else if (prPipe == 2) {
        cp->PipeSharedSTDOUT = 0;
      }
      else if (prPipe == 1) {
        cp->PipeSharedSTDIN = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int kwsysProcess_SetPipeFile(kwsysProcess* cp, int prPipe, const char* file)
{
  char** pfile;
  if (!cp) {
    return 0;
  }
  switch (prPipe) {
    case kwsysProcess_Pipe_STDIN:
      pfile = &cp->PipeFileSTDIN;
      break;
    case kwsysProcess_Pipe_STDOUT:
      pfile = &cp->PipeFileSTDOUT;
      break;
    case kwsysProcess_Pipe_STDERR:
      pfile = &cp->PipeFileSTDERR;
      break;
    default:
      return 0;
  }
  if (*pfile) {
    free(*pfile);
    *pfile = 0;
  }
  if (file) {
    *pfile = (char*)malloc(strlen(file) + 1);
    if (!*pfile) {
      return 0;
    }
    strcpy(*pfile, file);
  }

  /* If we are redirecting the pipe, do not share it or use a native
     pipe.  */
  if (*pfile) {
    kwsysProcess_SetPipeNative(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
  }
  return 1;
}